

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

double __thiscall despot::Parser::LogNumObservations(Parser *this)

{
  int __x;
  size_type sVar1;
  reference this_00;
  __type _Var2;
  int local_1c;
  double dStack_18;
  int i;
  double log_num_obss;
  Parser *this_local;
  
  dStack_18 = 0.0;
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::size(&this->obs_vars_)
    ;
    if (sVar1 <= (ulong)(long)local_1c) break;
    this_00 = std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::operator[]
                        (&this->obs_vars_,(long)local_1c);
    __x = Variable::Size(&this_00->super_Variable);
    _Var2 = std::log2<int>(__x);
    dStack_18 = _Var2 + dStack_18;
    local_1c = local_1c + 1;
  }
  return dStack_18;
}

Assistant:

double Parser::LogNumObservations() const {
	double log_num_obss = 0;

	for (int i = 0; i < obs_vars_.size(); i++) {
		log_num_obss += log2(obs_vars_[i].Size());
	}

	return log_num_obss;
}